

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

void Assimp::FindMeshCenterTransformed
               (aiMesh *mesh,aiVector3D *out,aiVector3D *min,aiVector3D *max,aiMatrix4x4 *m)

{
  aiVector3D *v1;
  aiVector3t<float> aVar1;
  undefined8 local_88;
  float local_80;
  aiVector3t<float> local_78;
  aiVector3t<float> local_68;
  aiVector3t<float> local_58;
  aiVector3t<float> local_48 [2];
  aiMatrix4x4 *local_30;
  aiMatrix4x4 *m_local;
  aiVector3D *max_local;
  aiVector3D *min_local;
  aiVector3D *out_local;
  aiMesh *mesh_local;
  
  local_30 = m;
  m_local = (aiMatrix4x4 *)max;
  max_local = min;
  min_local = out;
  out_local = (aiVector3D *)mesh;
  FindAABBTransformed(mesh,min,max,m);
  v1 = max_local;
  aVar1 = ::operator-((aiVector3t<float> *)m_local,max_local);
  local_68.z = aVar1.z;
  local_58.z = local_68.z;
  local_68._0_8_ = aVar1._0_8_;
  local_58.x = local_68.x;
  local_58.y = local_68.y;
  aVar1 = ::operator*(&local_58,0.5);
  local_78.z = aVar1.z;
  local_48[0].z = local_78.z;
  local_78._0_8_ = aVar1._0_8_;
  local_48[0].x = local_78.x;
  local_48[0].y = local_78.y;
  aVar1 = ::operator+(v1,local_48);
  local_88 = aVar1._0_8_;
  local_80 = aVar1.z;
  min_local->x = (float)(undefined4)local_88;
  min_local->y = (float)local_88._4_4_;
  min_local->z = local_80;
  return;
}

Assistant:

void FindMeshCenterTransformed (aiMesh* mesh, aiVector3D& out, aiVector3D& min,
    aiVector3D& max, const aiMatrix4x4& m)
{
    FindAABBTransformed(mesh,min,max,m);
    out = min + (max-min)*(ai_real)0.5;
}